

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

GlobalObject * Js::GlobalObject::New(ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  DynamicType *type;
  Recycler *pRVar4;
  undefined4 *puVar5;
  GlobalObject *this;
  RecyclerWeakReferenceBase *weakRef;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(scriptContext->recycler,0x34,0x34,0x68,false,false);
  type = DynamicType::New(scriptContext,TypeIds_GlobalObject,(RecyclableObject *)0x0,
                          (JavascriptMethod)0x0,&typeHandler->super_DynamicTypeHandler,false,false);
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x1a0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_665194b;
  data.filename._0_4_ = 0x1b;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00b49378;
    *puVar5 = 0;
  }
  this = (GlobalObject *)
         Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                   (pRVar4,0x208);
  if (this == (GlobalObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00b49378:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  GlobalObject(this,type,scriptContext);
  pRVar4 = scriptContext->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&pRVar4->weakReferenceMap,(char *)this,pRVar4);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&DynamicObject::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(pRVar4,weakRef);
  }
  bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
  if (bVar2) {
    DynamicTypeHandler::SetSingletonInstance
              (&typeHandler->super_DynamicTypeHandler,
               (RecyclerWeakReference<Js::DynamicObject> *)weakRef);
  }
  return this;
}

Assistant:

GlobalObject * GlobalObject::New(ScriptContext * scriptContext)
    {
        SimpleDictionaryTypeHandler* globalTypeHandler = SimpleDictionaryTypeHandler::New(
            scriptContext->GetRecycler(), InitialCapacity, InlineSlotCapacity, sizeof(Js::GlobalObject));

        DynamicType* globalType = DynamicType::New(
            scriptContext, TypeIds_GlobalObject, nullptr, nullptr, globalTypeHandler);

        GlobalObject* globalObject = RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(Var) * InlineSlotCapacity, GlobalObject, globalType, scriptContext);

#if ENABLE_FIXED_FIELDS
        globalTypeHandler->SetSingletonInstanceIfNeeded(scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicObject>(globalObject));
#endif

        return globalObject;
    }